

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O3

int dlep_extension_radio_write_destination
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  oonf_log_source oVar1;
  uint uVar2;
  uint uVar3;
  oonf_layer2_neigh *poVar4;
  char *pcVar5;
  oonf_layer2_neigh_key_str nbuf;
  
  poVar4 = dlep_session_get_local_l2_neighbor(session,neigh);
  if (poVar4 == (oonf_layer2_neigh *)0x0) {
    oVar1 = session->log_source;
    uVar3 = 0xffffffff;
    if ((log_global_mask[oVar1] & 4) != 0) {
      pcVar5 = oonf_layer2_neigh_key_to_string(&nbuf,neigh,true);
      oonf_log(LOG_SEVERITY_WARN,oVar1,"src/generic/dlep/dlep_extension.c",0x189,(void *)0x0,0,
               "Could not find l2neigh for neighbor %s",pcVar5);
    }
  }
  else {
    uVar3 = dlep_writer_map_l2neigh_data
                      (&session->writer,ext,poVar4->data,poVar4->network->neighdata);
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      oVar1 = session->log_source;
      if ((log_global_mask[oVar1] & 4) != 0) {
        uVar2 = ext->id;
        pcVar5 = oonf_layer2_neigh_key_to_string(&nbuf,neigh,true);
        oonf_log(LOG_SEVERITY_WARN,oVar1,"src/generic/dlep/dlep_extension.c",0x191,(void *)0x0,0,
                 "tlv mapping for extension %d and neighbor %s failed: %d",(ulong)uVar2,pcVar5,
                 (ulong)uVar3);
      }
    }
  }
  return uVar3;
}

Assistant:

int
dlep_extension_radio_write_destination(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh) {
  struct oonf_layer2_neigh *l2neigh;
  union oonf_layer2_neigh_key_str nbuf;
  int result;

  l2neigh = dlep_session_get_local_l2_neighbor(session, neigh);
  if (!l2neigh) {
    OONF_WARN(session->log_source,
      "Could not find l2neigh "
      "for neighbor %s",
      oonf_layer2_neigh_key_to_string(&nbuf, neigh, true));
    return -1;
  }

  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2neigh->data, l2neigh->network->neighdata);
  if (result) {
    OONF_WARN(session->log_source,
      "tlv mapping for extension %d and neighbor %s failed: %d",
      ext->id, oonf_layer2_neigh_key_to_string(&nbuf, neigh, true), result);
    return result;
  }
  return 0;
}